

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

void __thiscall TPZMatrix<float>::Diagonal(TPZMatrix<float> *this,float val)

{
  _func_int **pp_Var1;
  float *pfVar2;
  long lVar3;
  int64_t col;
  long lVar4;
  int64_t row;
  long lVar5;
  float local_30;
  float local_2c;
  
  local_2c = val;
  if ((this->super_TPZBaseMatrix).fCol != (this->super_TPZBaseMatrix).fRow) {
    Error("Diagonal (TPZMatrix<>*) <TPZMatrix<>must be square>",(char *)0x0);
  }
  for (lVar5 = 0; lVar5 < (this->super_TPZBaseMatrix).fRow; lVar5 = lVar5 + 1) {
    for (lVar4 = 0; lVar4 < (this->super_TPZBaseMatrix).fCol; lVar4 = lVar4 + 1) {
      if (lVar5 == lVar4) {
        pp_Var1 = (this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable;
        pfVar2 = &local_2c;
        lVar3 = lVar5;
      }
      else {
        local_30 = 0.0;
        pp_Var1 = (this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable;
        pfVar2 = &local_30;
        lVar3 = lVar4;
      }
      (*pp_Var1[0x23])(this,lVar5,lVar3,pfVar2);
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::Diagonal(TVar val) {
    
    if ( Cols() != Rows() ) {
        Error( "Diagonal (TPZMatrix<>*) <TPZMatrix<>must be square>" );
    }
    for ( int64_t row = 0; row < Rows(); row++) {
        for ( int64_t col = 0; col < Cols(); col++ ) {
            (row == col)? PutVal(row,col,val):PutVal(row,col,0.);
        }
    }
}